

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::unitPropagate(Solver *this)

{
  size_type sVar1;
  uint uVar2;
  uint uVar3;
  Literal p;
  SharedContext *pSVar4;
  buf_type *pbVar5;
  bool bVar6;
  PropResult PVar7;
  uint uVar8;
  pointer pLVar10;
  pointer plVar11;
  ulong uVar12;
  buf_type *pbVar13;
  buf_type *pbVar14;
  reverse_iterator<Clasp::GenericWatch_*> __tmp;
  buf_type *pbVar15;
  long lVar16;
  reverse_iterator<Clasp::GenericWatch_*> local_48;
  reverse_iterator<Clasp::GenericWatch_*> local_40;
  reverse_iterator<Clasp::GenericWatch_*> local_38;
  ulong uVar9;
  
  sVar1 = (this->levels_).super_type.ebo_.size;
  pSVar4 = this->shared_;
  uVar2 = (pSVar4->btig_).graph_.ebo_.size;
  while( true ) {
    uVar3 = (this->assign_).front;
    if (uVar3 == (this->assign_).trail.ebo_.size) {
      if (sVar1 == 0) {
        bVar6 = Assignment::markUnits(&this->assign_);
        return bVar6;
      }
      return true;
    }
    (this->assign_).front = uVar3 + 1;
    pLVar10 = (this->assign_).trail.ebo_.buf;
    p.rep_ = pLVar10[uVar3].rep_;
    plVar11 = (this->watches_).ebo_.buf + (p.rep_ >> 1);
    if ((p.rep_ >> 1 < uVar2) &&
       (bVar6 = ShortImplicationsGraph::propagate(&pSVar4->btig_,this,p), !bVar6)) break;
    uVar3 = (plVar11->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
            left_;
    uVar9 = (ulong)uVar3;
    if (7 < uVar9) {
      pbVar15 = (plVar11->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                buf_;
      uVar12 = 0;
      pbVar13 = pbVar15;
      while (uVar9 != uVar12) {
        PVar7 = ClauseHead::propagate(*(ClauseHead **)(pbVar15 + uVar12),this,p,&pLVar10->rep_);
        if (((ushort)PVar7 >> 8 & 1) != 0) {
          pLVar10 = *(pointer *)(pbVar15 + uVar12);
          *(pointer *)pbVar13 = pLVar10;
          pbVar13 = pbVar13 + 8;
        }
        uVar12 = uVar12 + 8;
        if (((ushort)PVar7 & 1) == 0) {
          if (uVar9 != uVar12) {
            memmove(pbVar13,pbVar15 + uVar12,uVar9 - uVar12);
          }
          (plVar11->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_
               = (uVar3 + ((int)pbVar13 -
                          *(int *)&(plVar11->super_type).
                                   super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                                   buf_)) - (int)uVar12;
          return false;
        }
      }
      (plVar11->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_ =
           (int)pbVar13 -
           *(int *)&(plVar11->super_type).
                    super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
    }
    uVar3 = (plVar11->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
            right_;
    uVar8 = *(uint *)&(plVar11->super_type).
                      super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8 &
            0x7fffffff;
    uVar9 = (ulong)uVar8;
    if (0xf < uVar8 - uVar3) {
      pbVar13 = (plVar11->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                buf_;
      pbVar15 = pbVar13 + uVar9;
      lVar16 = uVar3 - uVar9;
      pbVar5 = pbVar13 + uVar9 + -8;
      while (pbVar14 = pbVar5, lVar16 != 0) {
        uVar8 = (**(code **)**(undefined8 **)(pbVar14 + -8))
                          (*(undefined8 **)(pbVar14 + -8),this,p.rep_,pbVar14);
        if ((uVar8 >> 8 & 1) != 0) {
          *(undefined4 *)(pbVar15 + -8) = *(undefined4 *)pbVar14;
          *(undefined8 *)(pbVar15 + -0x10) = *(undefined8 *)(pbVar14 + -8);
          pbVar15 = pbVar15 + -0x10;
        }
        lVar16 = lVar16 + 0x10;
        pbVar5 = pbVar14 + -0x10;
        if ((uVar8 & 1) == 0) {
          local_40.current = (GenericWatch *)(pbVar14 + -8);
          local_48.current = (GenericWatch *)(pbVar13 + uVar3);
          std::
          copy<std::reverse_iterator<Clasp::GenericWatch*>,std::reverse_iterator<Clasp::GenericWatch*>>
                    (&local_38,&local_40,&local_48);
          (plVar11->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_
               = (int)local_38.current -
                 *(int *)&(plVar11->super_type).
                          super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
          return false;
        }
      }
      (plVar11->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ =
           (int)pbVar15 -
           *(int *)&(plVar11->super_type).
                    super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
    }
  }
  return false;
}

Assistant:

bool Solver::unitPropagate() {
	assert(!hasConflict());
	Literal p, q, r;
	uint32 idx, ignore, DL = decisionLevel();
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	const uint32 maxIdx = btig.size();
	while ( !assign_.qEmpty() ) {
		p             = assign_.qPop();
		idx           = p.id();
		WatchList& wl = watches_[idx];
		// first: short clause BCP
		if (idx < maxIdx && !btig.propagate(*this, p)) {
			return false;
		}
		// second: clause BCP
		if (wl.left_size() != 0) {
			WatchList::left_iterator it, end, j = wl.left_begin();
			Constraint::PropResult res;
			for (it = wl.left_begin(), end = wl.left_end();  it != end;  ) {
				ClauseWatch& w = *it++;
				res = w.head->ClauseHead::propagate(*this, p, ignore);
				if (res.keepWatch) {
					*j++ = w;
				}
				if (!res.ok) {
					wl.shrink_left(std::copy(it, end, j));
					return false;
				}
			}
			wl.shrink_left(j);
		}
		// third: general constraint BCP
		if (wl.right_size() != 0) {
			WatchList::right_iterator it, end, j = wl.right_begin();
			Constraint::PropResult res;
			for (it = wl.right_begin(), end = wl.right_end(); it != end; ) {
				GenericWatch& w = *it++;
				res = w.propagate(*this, p);
				if (res.keepWatch) {
					*j++ = w;
				}
				if (!res.ok) {
					wl.shrink_right(std::copy(it, end, j));
					return false;
				}
			}
			wl.shrink_right(j);
		}
	}
	return DL || assign_.markUnits();
}